

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verilogAST.hpp
# Opt level: O1

Cast * __thiscall verilogAST::Cast::clone_impl(Cast *this)

{
  uint uVar1;
  int iVar2;
  Cast *pCVar3;
  undefined4 extraout_var;
  
  pCVar3 = (Cast *)operator_new(0x18);
  uVar1 = this->width;
  iVar2 = (*(((this->expr)._M_t.
              super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
              ._M_t.
              super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
              .super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl)->super_Node).
            _vptr_Node[3])();
  (pCVar3->super_Expression).super_Node._vptr_Node = (_func_int **)&PTR_toString_abi_cxx11__00176570
  ;
  pCVar3->width = uVar1;
  (pCVar3->expr)._M_t.
  super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>._M_t.
  super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>.
  super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl =
       (Expression *)CONCAT44(extraout_var,iVar2);
  return pCVar3;
}

Assistant:

virtual Cast* clone_impl() const override {
    return new Cast(this->width, this->expr->clone());
  }